

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliques.cpp
# Opt level: O3

void find_cliques(void)

{
  pointer piVar1;
  bool bVar2;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __first;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __last;
  int iVar3;
  long lVar4;
  int *piVar5;
  ostream *poVar6;
  long *plVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  pointer piVar14;
  long lVar15;
  long lVar16;
  pair<int_*,_long> pVar17;
  set<int,_std::less<int>,_std::allocator<int>_> P;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
  local_118;
  ulong local_100;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_98;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  freopen("cliques.txt","w",_stdout);
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_original_len._0_4_ = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < V) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_f8,(int *)&local_118);
      piVar14 = edge.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(int)local_118._M_original_len].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar1 = edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)local_118._M_original_len].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if (piVar14 != piVar1) {
        lVar4 = (long)piVar1 - (long)piVar14 >> 2;
        pVar17 = std::get_temporary_buffer<int>((lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
        piVar5 = pVar17.first;
        if (piVar5 == (int *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar14,piVar1);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar14,piVar1,piVar5);
        }
        operator_delete(piVar5);
      }
      local_118._M_original_len._0_4_ = (int)local_118._M_original_len + 1;
    } while ((int)local_118._M_original_len < V);
  }
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_60,&local_f8);
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl._0_8_ = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  bron_kerbosch((set<int,_std::less<int>,_std::allocator<int>_> *)&local_98,
                (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                (set<int,_std::less<int>,_std::allocator<int>_> *)&local_c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_98);
  __last._M_current = DAT_00119228._M_current;
  __first._M_current = (anonymous_namespace)::cliques._M_current;
  if ((anonymous_namespace)::cliques._M_current != DAT_00119228._M_current) {
    lVar4 = ((long)DAT_00119228._M_current - (long)(anonymous_namespace)::cliques._M_current >> 3) *
            -0x5555555555555555;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
    ::_Temporary_buffer(&local_118,(anonymous_namespace)::cliques,
                        (lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
    if (local_118._M_buffer == (vector<int,_std::allocator<int>_> *)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)>>
                (__first,__last,
                 (_Iter_comp_iter<bool_(*)(const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&)>
                  )0x10a7a1);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::vector<int,std::allocator<int>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)>>
                (__first,__last,local_118._M_buffer,local_118._M_len,
                 (_Iter_comp_iter<bool_(*)(const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&)>
                  )0x10a7a1);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
    ::~_Temporary_buffer(&local_118);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distribution:",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  uVar11 = (int)((ulong)((long)DAT_00119228._M_current -
                        (long)(anonymous_namespace)::cliques._M_current) >> 3) * -0x55555555 - 1;
  if (-1 < (int)uVar11) {
    lVar4 = (ulong)uVar11 * 0x18 + 8;
    uVar13 = 0;
    pvVar8 = (anonymous_namespace)::cliques._M_current;
    lVar15 = (ulong)uVar11 + 1;
    iVar3 = 0;
    do {
      iVar12 = iVar3;
      if ((ulong)(long)(int)uVar13 <
          (ulong)(*(long *)((long)&(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar4) -
                  *(long *)((long)pvVar8 + lVar4 + -8) >> 2)) {
        if (0 < iVar12) {
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
          plVar7 = (long *)std::ostream::operator<<(poVar6,iVar12);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          pvVar8 = (anonymous_namespace)::cliques._M_current;
        }
        uVar13 = (ulong)(*(long *)((long)&(pvVar8->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar4) -
                        *(long *)((long)pvVar8 + lVar4 + -8)) >> 2;
        iVar12 = 0;
      }
      lVar4 = lVar4 + -0x18;
      lVar16 = lVar15 + -1;
      bVar2 = 0 < lVar15;
      lVar15 = lVar16;
      iVar3 = iVar12 + 1;
    } while (lVar16 != 0 && bVar2);
    if (-1 < iVar12) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      plVar7 = (long *)std::ostream::operator<<(poVar6,iVar12 + 1);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cliques:",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  uVar13 = 0;
  while (uVar9 = ((long)DAT_00119228._M_current - (long)(anonymous_namespace)::cliques._M_current >>
                 3) * -0x5555555555555555, uVar13 <= uVar9 && uVar9 - uVar13 != 0) {
    local_100 = uVar13 + 1;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"): ",3);
    piVar14 = (anonymous_namespace)::cliques._M_current[uVar13].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    if ((anonymous_namespace)::cliques._M_current[uVar13].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        piVar14) {
      lVar4 = 0;
      uVar9 = 0;
      do {
        pmVar10 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&name_abi_cxx11_,(key_type *)((long)piVar14 + lVar4));
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pmVar10->_M_dataplus)._M_p,
                            pmVar10->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,". ",2);
        uVar9 = uVar9 + 1;
        piVar14 = (anonymous_namespace)::cliques._M_current[uVar13].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        lVar4 = lVar4 + 4;
      } while (uVar9 < (ulong)((long)(anonymous_namespace)::cliques._M_current[uVar13].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar14 >> 2));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    uVar13 = local_100;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_f8);
  return;
}

Assistant:

void find_cliques() {
    freopen("cliques.txt", "w", stdout); // output file

    set <int> P;
    for (int i = 0; i < V; i++) {
        P.insert(i);
        stable_sort(edge[i].begin(), edge[i].end());
    }
    
    bron_kerbosch(set<int>(), P, set<int>());

    stable_sort(cliques.begin(), cliques.end(), compare_vectors_by_size);

    cout << "Distribution:" << endl;
    int max_size = 0;
    int max_counter = 0;
    for (int i = cliques.size()-1; i >= 0 ; i--) {
        if (cliques[i].size() > max_size) {
            if (max_counter > 0) {
                cout << max_size << ": " << max_counter << endl;
            }
            max_size = cliques[i].size();
            max_counter = 0;
        }

        max_counter++;
    }
    if (max_counter > 0) {
        cout << max_size << ": " << max_counter << endl;
    }

    cout << "Cliques:" << endl;
    for (int i = 0; i < cliques.size(); i++) {
        cout << i + 1 << "(" << cliques[i].size() << "): ";
        for (int j = 0; j < cliques[i].size(); j++) {
            cout << name[cliques[i][j]] << ". ";
        }
        cout << endl;
    }
}